

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O2

PList * p_ini_file_keys(PIniFile *file,pchar *section)

{
  int iVar1;
  pchar *data;
  PList *list;
  pchar *ppVar2;
  
  if (file == (PIniFile *)0x0) {
    list = (PList *)0x0;
  }
  else {
    list = (PList *)0x0;
    if ((section != (pchar *)0x0) && (file->is_parsed != 0)) {
      do {
        file = (PIniFile *)file->sections;
        if (file == (PIniFile *)0x0) {
          return (PList *)0x0;
        }
        ppVar2 = file->path;
        iVar1 = strcmp(*(char **)ppVar2,section);
      } while (iVar1 != 0);
      list = (PList *)0x0;
      while (ppVar2 = *(pchar **)(ppVar2 + 8), ppVar2 != (pchar *)0x0) {
        data = p_strdup((pchar *)**(undefined8 **)ppVar2);
        list = p_list_prepend(list,data);
      }
    }
  }
  return list;
}

Assistant:

P_LIB_API PList *
p_ini_file_keys (const PIniFile	*file,
		 const pchar	*section)
{
	PList	*ret;
	PList	*item;

	if (P_UNLIKELY (file == NULL || file->is_parsed == FALSE || section == NULL))
		return NULL;

	ret = NULL;

	for (item = file->sections; item != NULL; item = item->next)
		if (strcmp (((PIniSection *) item->data)->name, section) == 0)
			break;

	if (item == NULL)
		return NULL;

	for (item = ((PIniSection *) item->data)->keys; item != NULL; item = item->next)
		ret = p_list_prepend (ret, p_strdup (((PIniParameter *) item->data)->name));

	return ret;
}